

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

bool slang::syntax::SyntaxFacts::isPossibleEdgeDescriptor(TokenKind kind)

{
  return (bool)((byte)(0x1000024 >> ((byte)kind & 0x1f)) & kind < Dot);
}

Assistant:

bool SyntaxFacts::isPossibleEdgeDescriptor(TokenKind kind) {
    switch (kind) {
        case TokenKind::IntegerLiteral:
        case TokenKind::Identifier:
        case TokenKind::Comma:
            return true;
        default:
            return false;
    }
}